

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

int __thiscall QAbstractItemViewPrivate::init(QAbstractItemViewPrivate *this,EVP_PKEY_CTX *ctx)

{
  Connection *pCVar1;
  QWidget *this_00;
  QScrollBar *pQVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  ScrollMode SVar6;
  QStyledItemDelegate *this_01;
  undefined4 *puVar7;
  QStyle *pQVar8;
  long lVar9;
  long in_FS_OFFSET;
  QSlotObjectBase local_a8;
  QSlotObjectBase local_98;
  QSlotObjectBase local_88;
  QSlotObjectBase local_78;
  code *local_68;
  undefined8 local_60;
  Connection local_58;
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  this_01 = (QStyledItemDelegate *)operator_new(0x10);
  QStyledItemDelegate::QStyledItemDelegate(this_01,&this_00->super_QObject);
  QAbstractItemView::setItemDelegate((QAbstractItemView *)this_00,(QAbstractItemDelegate *)this_01);
  lVar9 = 0;
  QAbstractSlider::setRange
            (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,0,0);
  QAbstractSlider::setRange
            (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,0,0);
  pQVar2 = (this->super_QAbstractScrollAreaPrivate).vbar;
  local_78.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x271;
  local_78._4_4_ = 0;
  local_78.m_impl = (ImplFn)0x0;
  local_68 = QAbstractSlider::actionTriggered;
  local_60 = 0;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::QCallableObject<void_(QAbstractItemView::*)(int),_QtPrivate::List<int>,_void>::
       impl;
  *(undefined8 *)(puVar7 + 4) = 0x271;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_58,(void **)pQVar2,(QObject *)&local_68,(void **)this_00,&local_78,
             (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  pQVar2 = (this->super_QAbstractScrollAreaPrivate).hbar;
  local_88.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x279;
  local_88._4_4_ = 0;
  local_88.m_impl = (ImplFn)0x0;
  local_68 = QAbstractSlider::actionTriggered;
  local_60 = 0;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::QCallableObject<void_(QAbstractItemView::*)(int),_QtPrivate::List<int>,_void>::
       impl;
  *(undefined8 *)(puVar7 + 4) = 0x279;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)pQVar2,(QObject *)&local_68,(void **)this_00,&local_88,
             (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  pQVar2 = (this->super_QAbstractScrollAreaPrivate).vbar;
  local_98.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x281;
  local_98._4_4_ = 0;
  local_98.m_impl = (ImplFn)0x0;
  local_68 = QAbstractSlider::valueChanged;
  local_60 = 0;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::QCallableObject<void_(QAbstractItemView::*)(int),_QtPrivate::List<int>,_void>::
       impl;
  *(undefined8 *)(puVar7 + 4) = 0x281;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            (local_48,(void **)pQVar2,(QObject *)&local_68,(void **)this_00,&local_98,
             (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  pQVar2 = (this->super_QAbstractScrollAreaPrivate).hbar;
  local_a8.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x289;
  local_a8._4_4_ = 0;
  local_a8.m_impl = (ImplFn)0x0;
  local_68 = QAbstractSlider::valueChanged;
  local_60 = 0;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::QCallableObject<void_(QAbstractItemView::*)(int),_QtPrivate::List<int>,_void>::
       impl;
  *(undefined8 *)(puVar7 + 4) = 0x289;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            (local_40,(void **)pQVar2,(QObject *)&local_68,(void **)this_00,&local_a8,
             (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  do {
    pCVar1 = (this->scrollbarConnections)._M_elems + lVar9;
    pvVar3 = pCVar1->d_ptr;
    pvVar4 = pCVar1[1].d_ptr;
    pvVar5 = *(void **)(local_50 + lVar9 * 8);
    pCVar1 = (this->scrollbarConnections)._M_elems + lVar9;
    pCVar1->d_ptr = (&local_58)[lVar9].d_ptr;
    pCVar1[1].d_ptr = pvVar5;
    (&local_58)[lVar9].d_ptr = pvVar3;
    *(void **)(local_50 + lVar9 * 8) = pvVar4;
    lVar9 = lVar9 + 2;
  } while (lVar9 != 4);
  lVar9 = 0x18;
  do {
    QMetaObject::Connection::~Connection((Connection *)((long)&local_58.d_ptr + lVar9));
    lVar9 = lVar9 + -8;
  } while (lVar9 != -8);
  QWidget::setBackgroundRole((this->super_QAbstractScrollAreaPrivate).viewport,Base);
  QWidget::setAttribute(this_00,WA_InputMethodEnabled,true);
  pQVar8 = QWidget::style(this_00);
  SVar6 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0x6f,0,this_00,0);
  this->verticalScrollMode = SVar6;
  pQVar8 = QWidget::style(this_00);
  SVar6 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0x6f,0,this_00,0);
  this->horizontalScrollMode = SVar6;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::init()
{
    Q_Q(QAbstractItemView);
    q->setItemDelegate(new QStyledItemDelegate(q));

    vbar->setRange(0, 0);
    hbar->setRange(0, 0);

    scrollbarConnections = {
        QObject::connect(vbar, &QScrollBar::actionTriggered,
                         q, &QAbstractItemView::verticalScrollbarAction),
        QObject::connect(hbar, &QScrollBar::actionTriggered,
                         q, &QAbstractItemView::horizontalScrollbarAction),
        QObject::connect(vbar, &QScrollBar::valueChanged,
                         q, &QAbstractItemView::verticalScrollbarValueChanged),
        QObject::connect(hbar, &QScrollBar::valueChanged,
                         q, &QAbstractItemView::horizontalScrollbarValueChanged)
    };
    viewport->setBackgroundRole(QPalette::Base);

    q->setAttribute(Qt::WA_InputMethodEnabled);

    verticalScrollMode = static_cast<QAbstractItemView::ScrollMode>(q->style()->styleHint(QStyle::SH_ItemView_ScrollMode, nullptr, q, nullptr));
    horizontalScrollMode = static_cast<QAbstractItemView::ScrollMode>(q->style()->styleHint(QStyle::SH_ItemView_ScrollMode, nullptr, q, nullptr));
}